

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.cpp
# Opt level: O0

int banksia::coordinateStringToPos(char *str)

{
  char cVar1;
  char cVar2;
  int row;
  int col;
  char rowChr;
  char colChr;
  char *str_local;
  int local_4;
  
  cVar1 = *str;
  cVar2 = str[1];
  if ((((cVar1 < 'a') || ('h' < cVar1)) || (cVar2 < '1')) || ('8' < cVar2)) {
    local_4 = -1;
  }
  else {
    local_4 = (7 - (cVar2 + -0x31)) * 8 + cVar1 + -0x61;
  }
  return local_4;
}

Assistant:

int coordinateStringToPos(const char* str) {
        auto colChr = str[0], rowChr = str[1];
        if (colChr >= 'a' && colChr <= 'h' && rowChr >= '1' && rowChr <= '8') {
            int col = colChr - 'a';
            int row = rowChr - '1';
            
            return (7 - row) * 8 + col;
        }
        return -1;
    }